

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiceDriver.cpp
# Opt level: O1

bool test_Dice(void)

{
  return true;
}

Assistant:

bool test_Dice() {
    try {
        Dice* dice = new Dice();
        delete (dice);
        return true;
    }
    catch (int e) {
        return false;
    }
}